

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidget::setAccessibleIdentifier(QWidget *this,QString *identifier)

{
  bool bVar1;
  QString *s1;
  long in_FS_OFFSET;
  code *local_40;
  undefined8 local_38;
  QWidget *pQStack_30;
  undefined8 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  s1 = (QString *)(*(long *)&this->field_0x8 + 0x168);
  bVar1 = ::comparesEqual(s1,identifier);
  if (!bVar1) {
    QString::operator=(s1,(QString *)identifier);
    local_40 = QFont::strikeOut;
    local_38 = 0xaaaaaaaa000080e0;
    local_28 = 0xaaaaaaaaffffffff;
    pQStack_30 = this;
    QAccessible::updateAccessibility((QAccessibleEvent *)&local_40);
    QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidget::setAccessibleIdentifier(const QString &identifier)
{
    Q_D(QWidget);
    if (d->accessibleIdentifier == identifier)
        return;

    d->accessibleIdentifier = identifier;
    QAccessibleEvent event(this, QAccessible::IdentifierChanged);
    QAccessible::updateAccessibility(&event);
}